

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> * __thiscall
LongReadsMapper::create_read_paths
          (vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> *__return_storage_ptr__,
          LongReadsMapper *this,vector<long,_std::allocator<long>_> *backbone,
          vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
          *filtered_read_mappings,ReadPathParams *read_path_params)

{
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_00;
  pointer plVar1;
  long lVar2;
  pointer pvVar3;
  pointer puVar4;
  pointer pRVar5;
  iterator iVar6;
  char *pcVar7;
  long lVar8;
  key_type_conflict1 *__k;
  ulong uVar9;
  uint uVar10;
  allocator local_101;
  LongReadsMapper *local_100;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *local_f8;
  ReadPathParams *local_f0;
  vector<long,_std::allocator<long>_> *local_e8;
  string seq;
  _Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_> local_c0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  useful_read;
  ReadSequenceBuffer sequenceGetter;
  
  useful_read._M_h._M_buckets = &useful_read._M_h._M_single_bucket;
  useful_read._M_h._M_bucket_count = 1;
  useful_read._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  useful_read._M_h._M_element_count = 0;
  useful_read._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  useful_read._M_h._M_rehash_policy._M_next_resize = 0;
  useful_read._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = this;
  local_f8 = filtered_read_mappings;
  local_f0 = read_path_params;
  local_e8 = backbone;
  ReadSequenceBuffer::ReadSequenceBuffer(&sequenceGetter,this->datastore,0x1e00000,0x400000);
  uVar10 = 0;
  while( true ) {
    plVar1 = (local_e8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_e8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)plVar1 >> 3) <= (ulong)uVar10)
    break;
    lVar2 = plVar1[uVar10];
    lVar8 = -lVar2;
    if (0 < lVar2) {
      lVar8 = lVar2;
    }
    pvVar3 = (local_100->reads_in_node).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = *(pointer *)
              ((long)&pvVar3[lVar8].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (__k = pvVar3[lVar8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start; __k != puVar4; __k = __k + 1) {
      iVar6 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&useful_read._M_h,__k);
      if (iVar6.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<unsigned_long_const&>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&useful_read._M_h,__k);
        pcVar7 = ReadSequenceBuffer::get_read_sequence(&sequenceGetter,*__k);
        std::__cxx11::string::string((string *)&seq,pcVar7,&local_101);
        std::vector<ReadCacheItem,std::allocator<ReadCacheItem>>::
        emplace_back<unsigned_long_const&,std::__cxx11::string&>
                  ((vector<ReadCacheItem,std::allocator<ReadCacheItem>> *)__return_storage_ptr__,__k
                   ,&seq);
        std::__cxx11::string::~string((string *)&seq);
      }
    }
    uVar10 = uVar10 + 1;
  }
  this_00 = &local_100->read_paths;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize(this_00,((long)(local_f8->
                          super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_f8->
                         super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  uVar10 = 0;
  while( true ) {
    uVar9 = (ulong)uVar10;
    pRVar5 = (__return_storage_ptr__->
             super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(__return_storage_ptr__->
                       super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pRVar5) / 0x28) <= uVar9) break;
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
              ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)&local_c0,
               (local_f8->
               super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + pRVar5[uVar9].id);
    create_read_path((vector<long,_std::allocator<long>_> *)&seq,local_100,
                     (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)&local_c0,local_f0
                     ,false,&(__return_storage_ptr__->
                             super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar9].seq);
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              ((this_00->
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start +
               (__return_storage_ptr__->
               super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar9].id,&seq);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&seq);
    std::_Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>::~_Vector_base(&local_c0);
    uVar10 = uVar10 + 1;
  }
  ReadSequenceBuffer::~ReadSequenceBuffer(&sequenceGetter);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&useful_read._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ReadCacheItem> LongReadsMapper::create_read_paths(const std::vector<sgNodeID_t> &backbone, const std::vector<std::vector<LongReadMapping>> filtered_read_mappings, const ReadPathParams &read_path_params) {
    std::unordered_set<uint64_t> useful_read;
    std::vector<ReadCacheItem> read_cache;
    ReadSequenceBuffer sequenceGetter(datastore);
    for (uint32_t bn = 0; bn < backbone.size(); bn++) {
        for (const auto &read:reads_in_node[std::abs(backbone[bn])]) {
            const auto find_it = useful_read.find(read);
            if (find_it == useful_read.cend()) {
                useful_read.emplace(read);
                std::string seq = sequenceGetter.get_read_sequence(read);
                read_cache.emplace_back(read, seq);
            }

        }
    }
    
    // TODO: HACK! Move this to somewhere it makes more sense
    read_paths.resize(filtered_read_mappings.size());
    
#pragma omp parallel for
    for (uint32_t rcp = 0; rcp < read_cache.size(); rcp++) {
        read_paths[read_cache[rcp].id] = create_read_path(filtered_read_mappings[read_cache[rcp].id], read_path_params, false, read_cache[rcp].seq);
    }

    return read_cache;
}